

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode AllowServerConnect(Curl_easy *data,_Bool *connected)

{
  CURLcode CVar1;
  timediff_t tVar2;
  uint local_4c;
  CURLcode local_2c;
  CURLcode result;
  timediff_t timeout_ms;
  _Bool *connected_local;
  Curl_easy *data_local;
  
  *connected = false;
  Curl_infof(data,"Preparing for accepting server on data port");
  Curl_pgrsTime(data,TIMER_STARTACCEPT);
  tVar2 = ftp_timeleft_accept(data);
  if (tVar2 < 0) {
    Curl_failf(data,"Accept timeout occurred while waiting server connect");
    data_local._4_4_ = CURLE_FTP_ACCEPT_TIMEOUT;
  }
  else {
    local_2c = ReceivedServerConnect(data,connected);
    data_local._4_4_ = local_2c;
    if (local_2c == CURLE_OK) {
      if ((*connected & 1U) == 0) {
        if ((data->set).accepttimeout == 0) {
          local_4c = 60000;
        }
        else {
          local_4c = (data->set).accepttimeout;
        }
        Curl_expire(data,(ulong)local_4c,EXPIRE_FTP_ACCEPT);
      }
      else {
        CVar1 = AcceptServerConnect(data);
        if (CVar1 != CURLE_OK) {
          return CVar1;
        }
        local_2c = InitiateTransfer(data);
        if (local_2c != CURLE_OK) {
          return local_2c;
        }
      }
      data_local._4_4_ = local_2c;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode AllowServerConnect(struct Curl_easy *data, bool *connected)
{
  timediff_t timeout_ms;
  CURLcode result = CURLE_OK;

  *connected = FALSE;
  infof(data, "Preparing for accepting server on data port");

  /* Save the time we start accepting server connect */
  Curl_pgrsTime(data, TIMER_STARTACCEPT);

  timeout_ms = ftp_timeleft_accept(data);
  if(timeout_ms < 0) {
    /* if a timeout was already reached, bail out */
    failf(data, "Accept timeout occurred while waiting server connect");
    return CURLE_FTP_ACCEPT_TIMEOUT;
  }

  /* see if the connection request is already here */
  result = ReceivedServerConnect(data, connected);
  if(result)
    return result;

  if(*connected) {
    result = AcceptServerConnect(data);
    if(result)
      return result;

    result = InitiateTransfer(data);
    if(result)
      return result;
  }
  else {
    /* Add timeout to multi handle and break out of the loop */
    Curl_expire(data, data->set.accepttimeout ?
                data->set.accepttimeout: DEFAULT_ACCEPT_TIMEOUT,
                EXPIRE_FTP_ACCEPT);
  }

  return result;
}